

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_iflist.c
# Opt level: O1

csp_iface_t * csp_iflist_get_by_name(char *name)

{
  csp_iface_s **ppcVar1;
  int iVar2;
  csp_iface_s *pcVar3;
  
  pcVar3 = interfaces;
  if (interfaces != (csp_iface_t *)0x0) {
    do {
      iVar2 = strncmp(pcVar3->name,name,10);
      if (iVar2 == 0) {
        return pcVar3;
      }
      ppcVar1 = &pcVar3->next;
      pcVar3 = *ppcVar1;
    } while (*ppcVar1 != (csp_iface_s *)0x0);
  }
  return (csp_iface_t *)0x0;
}

Assistant:

csp_iface_t * csp_iflist_get_by_name(const char * name) {
	csp_iface_t * ifc = interfaces;
	while (ifc) {
		if (strncmp(ifc->name, name, CSP_IFLIST_NAME_MAX) == 0) {
			return ifc;
		}
		ifc = ifc->next;
	}
	return NULL;
}